

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::filldata<const_char16_t[6]>::fill(ostream *stream,char16_t (*in) [6])

{
  char16_t (*s) [6];
  String local_38;
  ulong local_20;
  size_t i;
  char16_t (*in_local) [6];
  ostream *stream_local;
  
  i = (size_t)in;
  in_local = (char16_t (*) [6])stream;
  std::operator<<(stream,"[");
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    if (local_20 != 0) {
      std::operator<<((ostream *)in_local,", ");
    }
    s = in_local;
    toString<char16_t,_true>(&local_38,(char16_t *)(i + local_20 * 2));
    doctest::operator<<((ostream *)s,&local_38);
    String::~String(&local_38);
  }
  std::operator<<((ostream *)in_local,"]");
  return;
}

Assistant:

static void fill(std::ostream* stream, const T(&in)[N]) {
            *stream << "[";
            for (size_t i = 0; i < N; i++) {
                if (i != 0) { *stream << ", "; }
                *stream << (DOCTEST_STRINGIFY(in[i]));
            }
            *stream << "]";
        }